

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

bool __thiscall IRBuilder::IsLoopBodyReturnIPInstr(IRBuilder *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  this_00 = instr->m_dst;
  if ((this_00 != (Opnd *)0x0) && (OVar2 = IR::Opnd::GetKind(this_00), OVar2 == OpndKindReg)) {
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    return (StackSym *)this_00[1]._vptr_Opnd == this->m_loopBodyRetIPSym;
  }
  return false;
}

Assistant:

bool
IRBuilder::IsLoopBodyReturnIPInstr(IR::Instr * instr) const
{
     IR::Opnd * dst = instr->GetDst();
     return (dst && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym == m_loopBodyRetIPSym);
}